

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::ExtractSnapPropertyEntryInfo
               (SnapHandlerPropertyEntry *entry,PropertyId pid,PropertyAttributes attr,
               SnapEntryDataKindTag dataKind)

{
  SnapAttributeTag SVar1;
  BOOL BVar2;
  SnapEntryDataKindTag dataKind_local;
  PropertyAttributes attr_local;
  PropertyId pid_local;
  SnapHandlerPropertyEntry *entry_local;
  
  entry->PropertyRecordId = pid;
  SVar1 = operator&(attr,AttributeMask);
  entry->AttributeInfo = SVar1;
  BVar2 = Js::IsInternalPropertyId(pid);
  if ((pid == -1 || BVar2 != 0) || (attr & 8) == 8) {
    entry->DataKind = Clear;
  }
  else {
    entry->DataKind = dataKind;
  }
  return;
}

Assistant:

void ExtractSnapPropertyEntryInfo(SnapHandlerPropertyEntry* entry, Js::PropertyId pid, Js::PropertyAttributes attr, SnapEntryDataKindTag dataKind)
        {
            entry->PropertyRecordId = pid;
            entry->AttributeInfo = ((SnapAttributeTag)attr) & SnapAttributeTag::AttributeMask;

            if((pid == Js::Constants::NoProperty) | Js::IsInternalPropertyId(pid) | ((attr & PropertyDeleted) == PropertyDeleted))
            {
                entry->DataKind = SnapEntryDataKindTag::Clear;
            }
            else
            {
                entry->DataKind = dataKind;
            }
        }